

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double beta_sample(double a,double b,int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double __x;
  
  dVar4 = a + -1.0;
  __x = a + b + -2.0;
  if (__x < 0.0) {
    dVar5 = sqrt(__x);
  }
  else {
    dVar5 = SQRT(__x);
  }
  do {
    do {
      do {
        dVar6 = normal_01_sample(seed);
        dVar11 = (0.5 / dVar5) * dVar6 + dVar4 / __x;
      } while (dVar11 < 0.0);
    } while (1.0 < dVar11);
    iVar1 = (*seed % 0x1f31d) * 0x41a7;
    iVar3 = (*seed / 0x1f31d) * -0xb14;
    iVar2 = iVar1 + iVar3;
    iVar1 = iVar1 + iVar3 + 0x7fffffff;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    *seed = iVar1;
    dVar7 = log(dVar11 / dVar4);
    dVar8 = log((1.0 - dVar11) / (b + -1.0));
    dVar9 = log(__x);
    dVar10 = log((double)iVar1 * 4.656612875e-10);
  } while (dVar6 * 0.5 * dVar6 + dVar9 * __x + dVar7 * dVar4 + dVar8 * (b + -1.0) < dVar10);
  return dVar11;
}

Assistant:

double beta_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_SAMPLE samples the Beta PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    William Kennedy, James Gentle,
//    Algorithm BN,
//    Statistical Computing,
//    Dekker, 1980.
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double BETA_SAMPLE, a sample of the PDF.
//
{
  double mu;
  double stdev;
  double test;
  double u;
  double x;
  double y;

  mu = ( a - 1.0 ) / ( a + b - 2.0 );
  stdev = 0.5 / sqrt ( a + b - 2.0 );

  for ( ; ; )
  {
    y = normal_01_sample ( seed );

    x = mu + stdev * y;

    if ( x < 0.0 || 1.0 < x )
    {
      continue;
    }

    u = r8_uniform_01 ( seed );

    test =     ( a - 1.0 )     * log (         x   / ( a - 1.0 ) )
             + ( b - 1.0 )     * log ( ( 1.0 - x ) / ( b - 1.0 ) )
             + ( a + b - 2.0 ) * log ( a + b - 2.0 ) + 0.5 * y * y;

    if ( log ( u ) <= test )
    {
      break;
    }

  }

  return x;
}